

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_> *
__thiscall
relive::ReLiveDB::findTracksInfo
          (vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
           *__return_storage_ptr__,ReLiveDB *this,string *pattern,FindTracksFilter filter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Tuple_impl<5UL,_int> _Var3;
  pointer pcVar4;
  pointer pcVar5;
  undefined4 uVar6;
  int iVar7;
  or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *c;
  pointer ptVar8;
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  select;
  order_by_t<long_relive::Stream::*> res;
  undefined1 local_290 [8];
  _Alloc_hider local_288;
  undefined1 local_280 [24];
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  long local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  pointer local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  pointer local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  local_1e0;
  like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_1c8;
  like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_198;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  columns_t<long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  local_138;
  or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_100;
  where_t<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  local_98;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  (__return_storage_ptr__->
  super__Vector_base<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  storage_abi_cxx11_();
  local_138.columns.
  super__Tuple_impl<0UL,_long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .super__Tuple_impl<4UL,_long_relive::Stream::*,_int_relive::Track::*>.
  super__Tuple_impl<5UL,_int_relive::Track::*>.super__Head_base<5UL,_int_relive::Track::*,_false>.
  _M_head_impl = (_Head_base<5UL,_int_relive::Track::*,_false>)0x50;
  local_138.columns.
  super__Tuple_impl<0UL,_long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .super__Tuple_impl<4UL,_long_relive::Stream::*,_int_relive::Track::*>.
  super__Head_base<4UL,_long_relive::Stream::*,_false>._M_head_impl = 0x78;
  local_138.columns.
  super__Tuple_impl<0UL,_long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Head_base<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_false>
  ._M_head_impl = 0x10;
  local_138.columns.
  super__Tuple_impl<0UL,_long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_false>
  ._M_head_impl = 0x30;
  local_138.columns.
  super__Tuple_impl<0UL,_long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_false>
  ._M_head_impl = 0x18;
  local_138.columns.
  super__Tuple_impl<0UL,_long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>
  .super__Head_base<0UL,_long_relive::Track::*,_false>._M_head_impl = 0;
  local_138.distinct = false;
  pcVar4 = (pattern->_M_dataplus)._M_p;
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar4,pcVar4 + pattern->_M_string_length);
  uVar6 = local_1f0._M_allocated_capacity._0_4_;
  local_1c8.pattern._M_string_length = (size_type)local_1f8;
  if (local_200 == &local_1f0) {
    local_280._12_4_ = local_1f0._12_4_;
    local_280._8_4_ = local_1f0._8_4_;
    local_290 = (undefined1  [8])local_280;
  }
  else {
    local_290 = (undefined1  [8])local_200;
  }
  local_280._4_4_ = local_1f0._M_allocated_capacity._4_4_;
  local_280._0_4_ = local_1f0._M_allocated_capacity._0_4_;
  local_288._M_p = local_1f8;
  local_1f8 = (pointer)0x0;
  local_1f0._M_allocated_capacity._0_4_ = local_1f0._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &local_1c8.pattern.field_2;
  local_1c8.arg = 0x10;
  if (local_290 == (undefined1  [8])local_280) {
    local_1c8.pattern.field_2._M_allocated_capacity =
         CONCAT44(local_1f0._M_allocated_capacity._4_4_,uVar6);
    local_1c8.pattern.field_2._8_4_ = local_280._8_4_;
    local_1c8.pattern.field_2._12_4_ = local_280._12_4_;
    local_1c8.pattern._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c8.pattern._M_dataplus._M_p = (pointer)local_290;
    local_1c8.pattern.field_2._M_allocated_capacity = local_280._0_8_;
  }
  pcVar4 = (pattern->_M_dataplus)._M_p;
  local_220 = &local_210;
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar4,pcVar4 + pattern->_M_string_length);
  local_198.pattern._M_string_length = (size_type)local_218;
  if (local_220 == &local_210) {
    local_280._8_8_ = local_210._8_8_;
    local_290 = (undefined1  [8])local_280;
  }
  else {
    local_290 = (undefined1  [8])local_220;
  }
  local_280._1_7_ = local_210._M_allocated_capacity._1_7_;
  local_280[0] = local_210._M_local_buf[0];
  local_288._M_p = local_218;
  local_218 = (pointer)0x0;
  local_210._M_local_buf[0] = '\0';
  paVar2 = &local_198.pattern.field_2;
  local_198.arg = 0x30;
  if (local_290 == (undefined1  [8])local_280) {
    local_198.pattern.field_2._8_8_ = local_280._8_8_;
    local_198.pattern._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_198.pattern._M_dataplus._M_p = (pointer)local_290;
  }
  local_198.pattern.field_2._M_allocated_capacity = local_280._0_8_;
  local_220 = &local_210;
  sqlite_orm::operator||(&local_100,&local_1c8,&local_198);
  sqlite_orm::
  where<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::string_relive::Track::*,std::__cxx11::string,void>,sqlite_orm::internal::like_t<std::__cxx11::string_relive::Track::*,std::__cxx11::string,void>>>
            (&local_98,(sqlite_orm *)&local_100,c);
  pcVar4 = local_280 + 8;
  local_290 = (undefined1  [8])((ulong)local_290 & 0xffffffff00000000);
  local_280._0_8_ = 0;
  local_280._8_8_ = local_280._8_8_ & 0xffffffffffffff00;
  local_268._M_p = (pointer)0x78;
  local_168._0_4_ = 0;
  local_288._M_p = pcVar4;
  local_160._M_p = (pointer)&local_150;
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,pcVar4,pcVar4);
  local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_p;
  local_168._0_4_ = -1;
  sqlite_orm::internal::storage_t<$86c824a$>::
  select<sqlite_orm::internal::columns_t<long_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Stream::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_long_relive::Stream::*,_int_relive::Track::*>,_sqlite_orm::internal::inner_join_t<relive::Stream,_sqlite_orm::internal::on_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long_relive::Track::*>_>_>,_sqlite_orm::internal::where_t<sqlite_orm::internal::or_condition_t<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>,_sqlite_orm::internal::order_by_t<long_relive::Stream::*>,_std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>
            (&local_1e0,&storage[abi:cxx11]()::_storage_abi_cxx11_,&local_138,
             (inner_join_t<relive::Stream,_sqlite_orm::internal::on_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long_relive::Track::*>_>_>
              )(ZEXT816(8) << 0x40),&local_98,(order_by_t<long_relive::Stream::*> *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_p != &local_150) {
    operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
  }
  if (local_288._M_p != pcVar4) {
    operator_delete(local_288._M_p,local_280._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.c.
         super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         .r.pattern._M_dataplus._M_p !=
      &local_98.c.
       super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       .r.pattern.field_2) {
    operator_delete(local_98.c.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .r.pattern._M_dataplus._M_p,
                    local_98.c.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .r.pattern.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.c.
         super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         .l.pattern._M_dataplus._M_p !=
      &local_98.c.
       super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       .l.pattern.field_2) {
    operator_delete(local_98.c.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .l.pattern._M_dataplus._M_p,
                    local_98.c.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .l.pattern.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.
         super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         .r.pattern._M_dataplus._M_p !=
      &local_100.
       super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       .r.pattern.field_2) {
    operator_delete(local_100.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .r.pattern._M_dataplus._M_p,
                    local_100.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .r.pattern.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.
         super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         .l.pattern._M_dataplus._M_p !=
      &local_100.
       super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       .l.pattern.field_2) {
    operator_delete(local_100.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .l.pattern._M_dataplus._M_p,
                    local_100.
                    super_binary_condition<sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_sqlite_orm::internal::like_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_relive::Track::*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .l.pattern.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.pattern._M_dataplus._M_p != paVar2) {
    operator_delete(local_198.pattern._M_dataplus._M_p,
                    local_198.pattern.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,
                    CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.pattern._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8.pattern._M_dataplus._M_p,
                    local_1c8.pattern.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,
                    CONCAT44(local_1f0._M_allocated_capacity._4_4_,
                             local_1f0._M_allocated_capacity._0_4_) + 1);
  }
  std::vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>::
  reserve(__return_storage_ptr__,
          ((long)local_1e0.
                 super__Vector_base<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1e0.
                 super__Vector_base<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
  if (local_1e0.
      super__Vector_base<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1e0.
      super__Vector_base<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar8 = local_1e0.
             super__Vector_base<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      _Var3.super__Head_base<5UL,_int,_false>._M_head_impl =
           (ptVar8->
           super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
           ).
           super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
           .
           super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
           .super__Tuple_impl<4UL,_long,_int>.super__Tuple_impl<5UL,_int>.
           super__Head_base<5UL,_int,_false>;
      if ((((filter == eNone) ||
           (_Var3.super__Head_base<5UL,_int,_false>._M_head_impl == 1 && filter == eTracks)) ||
          (_Var3.super__Head_base<5UL,_int,_false>._M_head_impl == 3 && filter == eJingle)) ||
         ((filter == eNarration &&
          ((_Var3.super__Head_base<5UL,_int,_false>._M_head_impl == 4 ||
           (_Var3.super__Head_base<5UL,_int,_false>._M_head_impl == 2)))))) {
        local_290 = (undefined1  [8])
                    (ptVar8->
                    super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                    ).super__Head_base<0UL,_long,_false>._M_head_impl;
        pcVar5 = (ptVar8->
                 super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 ).
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 .
                 super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p;
        local_288._M_p = pcVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,pcVar5,
                   pcVar5 + (ptVar8->
                            super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            ).
                            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            .
                            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_string_length);
        local_268._M_p = (pointer)&local_258;
        pcVar5 = (ptVar8->
                 super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 ).
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 .
                 super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,pcVar5,
                   pcVar5 + (ptVar8->
                            super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            ).
                            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            .
                            super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            .
                            super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_string_length);
        pcVar5 = (ptVar8->
                 super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 ).
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 .
                 super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                 .
                 super__Head_base<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p;
        local_248._M_p = (pointer)&local_238;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,pcVar5,
                   pcVar5 + (ptVar8->
                            super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            ).
                            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            .
                            super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            .
                            super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                            .
                            super__Head_base<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_string_length);
        local_228 = (ptVar8->
                    super__Tuple_impl<0UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                    ).
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                    .
                    super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>
                    .super__Tuple_impl<4UL,_long,_int>.super__Head_base<4UL,_long,_false>.
                    _M_head_impl;
        std::
        vector<relive::ReLiveDB::FindTracksInfo,_std::allocator<relive::ReLiveDB::FindTracksInfo>_>
        ::emplace_back<relive::ReLiveDB::FindTracksInfo>
                  (__return_storage_ptr__,(FindTracksInfo *)local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_p != &local_238) {
          operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_p != &local_258) {
          operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
        }
        if (local_288._M_p != pcVar4) {
          operator_delete(local_288._M_p,local_280._8_8_ + 1);
        }
      }
      ptVar8 = ptVar8 + 1;
    } while (ptVar8 != local_1e0.
                       super__Vector_base<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>,_std::allocator<std::tuple<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_int>_>_>
  ::~vector(&local_1e0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ReLiveDB::FindTracksInfo> ReLiveDB::findTracksInfo(const std::string& pattern, FindTracksFilter filter)
{
    std::lock_guard<Mutex> lock{_mutex};
    std::vector<FindTracksInfo> result;
    auto select = storage().select(columns(&Track::_id, &Stream::_name, &Track::_artist, &Track::_name, &Stream::_timestamp, &Track::_type), inner_join<Stream>(on(c(&Stream::_id) == &Track::_streamId)),
                                   where(like(&Track::_name, pattern) or like(&Track::_artist, pattern)), order_by(&Stream::_timestamp).desc());
    result.reserve(select.size());
    for (auto& t : select) {
        auto type = static_cast<Track::Type>(std::get<5>(t));
        if (filter == eNone || (filter == eTracks && type == Track::eMusic) || (filter == eJingle && type == Track::eJingle) || (filter == eNarration && (type == Track::eConversation || type == Track::eNarration))) {
            result.push_back({std::get<0>(t), std::get<1>(t), std::get<2>(t), std::get<3>(t), std::get<4>(t)});
        }
    }
    return result;
}